

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_set_quantizer(AV1_COMMON *cm,int min_qmlevel,int max_qmlevel,int q,int enable_chroma_deltaq
                      ,int enable_hdr_deltaq,_Bool is_allintra,aom_tune_metric tuning)

{
  SequenceHeader *pSVar1;
  double dVar2;
  code *pcVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  code *pcVar10;
  bool bVar11;
  int iVar12;
  double dVar13;
  
  uVar9 = (cm->delta_q_info).delta_q_present_flag;
  uVar4 = (ulong)(uint)q;
  if (q < (int)uVar9) {
    uVar4 = (ulong)uVar9;
  }
  iVar7 = (int)uVar4;
  (cm->quant_params).base_qindex = iVar7;
  (cm->quant_params).y_dc_delta_q = 0;
  if (enable_chroma_deltaq == 0) {
    iVar6 = 0;
    iVar5 = 0;
    iVar8 = 0;
    iVar12 = 0;
  }
  else {
    if (is_allintra && (tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) {
      pSVar1 = cm->seq_params;
      if (pSVar1->subsampling_x == 1) {
        if (pSVar1->subsampling_y == 1) {
          iVar5 = (int)(uVar4 >> 0x1f) + iVar7 >> 1;
          iVar6 = 0x1e;
          if (iVar5 < 0x1e) {
            iVar6 = iVar5;
          }
          if (iVar6 < 0xf) {
            iVar6 = 0xe;
          }
          iVar6 = 0xe - iVar6;
          iVar5 = iVar6;
        }
        else {
          if (pSVar1->subsampling_y != 0) goto LAB_001965a7;
          iVar8 = (int)(uVar4 >> 0x1f) + iVar7 >> 1;
          bVar11 = SBORROW4(iVar8,6);
          iVar5 = iVar8 + -6;
          iVar6 = 6;
LAB_001965e1:
          if (bVar11 != iVar5 < 0) {
            iVar6 = iVar8;
          }
          iVar5 = 0;
          if (iVar6 < 1) {
            iVar6 = 0;
            iVar5 = 0;
          }
        }
      }
      else {
LAB_001965a7:
        iVar6 = 0;
        if (pSVar1->subsampling_x == 0) {
          iVar5 = 0;
          if (pSVar1->subsampling_y == 0) {
            iVar8 = (int)(uVar4 >> 0x1f) + iVar7 >> 1;
            bVar11 = SBORROW4(iVar8,0x18);
            iVar5 = iVar8 + -0x18;
            iVar6 = 0x18;
            goto LAB_001965e1;
          }
        }
        else {
          iVar5 = 0;
        }
      }
      (cm->quant_params).u_dc_delta_q = iVar5;
      (cm->quant_params).u_ac_delta_q = iVar6;
      (cm->quant_params).v_dc_delta_q = iVar5;
      (cm->quant_params).v_ac_delta_q = iVar6;
      goto LAB_00196603;
    }
    iVar6 = 2;
    iVar5 = 2;
    iVar8 = 2;
    iVar12 = 2;
  }
  (cm->quant_params).u_dc_delta_q = iVar6;
  (cm->quant_params).v_dc_delta_q = iVar5;
  (cm->quant_params).u_ac_delta_q = iVar8;
  (cm->quant_params).v_ac_delta_q = iVar12;
LAB_00196603:
  if (enable_hdr_deltaq != 0) {
    dVar2 = ((double)iVar7 * 0.5 * -0.46 + 9.26) * 1.04;
    dVar2 = dVar2 + dVar2;
    uVar9 = (uint)(dVar2 + *(double *)(&DAT_004d9f50 + (ulong)(dVar2 < 0.0) * 8));
    iVar7 = -0x18;
    iVar6 = -0x18;
    if (-0x19 < (int)uVar9) {
      dVar2 = (double)(int)((int)uVar9 >> 0x1f & uVar9);
      dVar13 = 24.0;
      if (dVar2 <= 24.0) {
        dVar13 = dVar2;
      }
      iVar6 = (int)dVar13;
    }
    if (-0x19 < (int)uVar9) {
      dVar2 = (double)(int)((int)uVar9 >> 0x1f & uVar9);
      dVar13 = 24.0;
      if (dVar2 <= 24.0) {
        dVar13 = dVar2;
      }
      iVar7 = (int)dVar13;
    }
    (cm->quant_params).u_ac_delta_q = iVar6;
    (cm->quant_params).u_dc_delta_q = iVar6;
    (cm->quant_params).v_ac_delta_q = iVar7;
    (cm->quant_params).v_dc_delta_q = iVar7;
    if (iVar6 != iVar7) {
      cm->seq_params->separate_uv_delta_q = '\x01';
    }
  }
  if (is_allintra) {
    if ((tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) {
      pcVar3 = aom_get_qmlevel_luma_ssimulacra2;
      if (tuning != AOM_TUNE_SSIMULACRA2) {
        pcVar3 = aom_get_qmlevel_allintra;
      }
      pcVar10 = aom_get_qmlevel_allintra;
      if ((cm->seq_params->subsampling_x == 0) && (cm->seq_params->subsampling_y == 0)) {
        pcVar10 = aom_get_qmlevel_444_chroma;
      }
    }
    else {
      pcVar3 = aom_get_qmlevel_allintra;
      pcVar10 = pcVar3;
    }
  }
  else {
    pcVar3 = aom_get_qmlevel;
    pcVar10 = pcVar3;
  }
  iVar7 = (*pcVar3)(uVar4,min_qmlevel,max_qmlevel);
  (cm->quant_params).qmatrix_level_y = iVar7;
  iVar7 = (*pcVar10)((cm->quant_params).u_ac_delta_q + (cm->quant_params).base_qindex,min_qmlevel,
                     max_qmlevel);
  (cm->quant_params).qmatrix_level_u = iVar7;
  if (cm->seq_params->separate_uv_delta_q != '\0') {
    iVar7 = (*pcVar10)((cm->quant_params).v_ac_delta_q + (cm->quant_params).base_qindex,min_qmlevel,
                       max_qmlevel);
  }
  (cm->quant_params).qmatrix_level_v = iVar7;
  return;
}

Assistant:

void av1_set_quantizer(AV1_COMMON *const cm, int min_qmlevel, int max_qmlevel,
                       int q, int enable_chroma_deltaq, int enable_hdr_deltaq,
                       bool is_allintra, aom_tune_metric tuning) {
  // quantizer has to be reinitialized with av1_init_quantizer() if any
  // delta_q changes.
  CommonQuantParams *quant_params = &cm->quant_params;
  quant_params->base_qindex = AOMMAX(cm->delta_q_info.delta_q_present_flag, q);
  quant_params->y_dc_delta_q = 0;

  if (enable_chroma_deltaq) {
    if (is_allintra &&
        (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2)) {
      int chroma_dc_delta_q = 0;
      int chroma_ac_delta_q = 0;

      if (cm->seq_params->subsampling_x == 1 &&
          cm->seq_params->subsampling_y == 1) {
        // 4:2:0 subsampling: Constant chroma delta_q decrease (i.e. improved
        // chroma quality relative to luma) with gradual ramp-down for very low
        // qindexes.
        // Lowering chroma delta_q by 16 was found to improve SSIMULACRA 2
        // BD-Rate by 1.5-2% on Daala's subset1, as well as reducing chroma
        // artifacts (smudging, discoloration) during subjective quality
        // evaluations.
        // The ramp-down of chroma increase was determined by generating the
        // convex hull of SSIMULACRA 2 scores (for all boosts from 0-16), and
        // finding a linear equation that fits the convex hull.
        chroma_dc_delta_q = -clamp((quant_params->base_qindex / 2) - 14, 0, 16);
        chroma_ac_delta_q = chroma_dc_delta_q;
      } else if (cm->seq_params->subsampling_x == 1 &&
                 cm->seq_params->subsampling_y == 0) {
        // 4:2:2 subsampling: Constant chroma AC delta_q increase (i.e. improved
        // luma quality relative to chroma) with gradual ramp-down for very low
        // qindexes.
        // SSIMULACRA 2 appears to have some issues correctly scoring 4:2:2
        // material. Solely optimizing for maximum scores suggests a chroma AC
        // delta_q of 12 is the most efficient. However, visual inspection on
        // difficult-to-encode material resulted in chroma quality degrading too
        // much relative to luma, and chroma channels ending up being too small
        // compared to equivalent 4:4:4 or 4:2:0 encodes.
        // A chroma AC delta_q of 6 was selected because encoded chroma channels
        // have a much closer size to 4:4:4 and 4:2:0 encodes, and have more
        // favorable visual quality characteristics.
        // The ramp-down of chroma decrease was put into place to match 4:2:0
        // and 4:4:4 behavior. There were no special considerations on
        // SSIMULACRA 2 scores.
        chroma_dc_delta_q = 0;
        chroma_ac_delta_q = clamp((quant_params->base_qindex / 2), 0, 6);
      } else if (cm->seq_params->subsampling_x == 0 &&
                 cm->seq_params->subsampling_y == 0) {
        // 4:4:4 subsampling: Constant chroma AC delta_q increase (i.e. improved
        // luma quality relative to chroma) with gradual ramp-down for very low
        // qindexes.
        // Raising chroma AC delta_q by 24 was found to improve SSIMULACRA 2
        // BD-Rate by 2.5-3% on Daala's subset1, as well as providing a more
        // balanced bit allocation between the (relatively-starved) luma and
        // chroma channels.
        // Raising chroma DC delta_q appears to be harmful, both for SSIMULACRA
        // 2 scores and subjective quality (harshens blocking artifacts).
        // The ramp-down of chroma decrease was put into place so (lossy) QP 0
        // encodes still score within 0.1 SSIMULACRA 2 points of the equivalent
        // with no chroma delta_q (with a small efficiency improvement), while
        // encodes in the SSIMULACRA 2 <=90 range yield full benefits from this
        // adjustment.
        chroma_dc_delta_q = 0;
        chroma_ac_delta_q = clamp((quant_params->base_qindex / 2), 0, 24);
      }

      // TODO: bug https://crbug.com/aomedia/375221136 - find chroma_delta_q
      // values for 4:2:2 subsampling mode.
      quant_params->u_dc_delta_q = chroma_dc_delta_q;
      quant_params->u_ac_delta_q = chroma_ac_delta_q;
      quant_params->v_dc_delta_q = chroma_dc_delta_q;
      quant_params->v_ac_delta_q = chroma_ac_delta_q;
    } else {
      // TODO(aomedia:2717): need to design better delta
      quant_params->u_dc_delta_q = 2;
      quant_params->u_ac_delta_q = 2;
      quant_params->v_dc_delta_q = 2;
      quant_params->v_ac_delta_q = 2;
    }
  } else {
    quant_params->u_dc_delta_q = 0;
    quant_params->u_ac_delta_q = 0;
    quant_params->v_dc_delta_q = 0;
    quant_params->v_ac_delta_q = 0;
  }

  // following section 8.3.2 in T-REC-H.Sup15 document
  // to apply to AV1 qindex in the range of [0, 255]
  if (enable_hdr_deltaq) {
    int dqpCb = adjust_hdr_cb_deltaq(quant_params->base_qindex);
    int dqpCr = adjust_hdr_cr_deltaq(quant_params->base_qindex);
    quant_params->u_dc_delta_q = quant_params->u_ac_delta_q = dqpCb;
    quant_params->v_dc_delta_q = quant_params->v_ac_delta_q = dqpCr;
    if (dqpCb != dqpCr) {
      cm->seq_params->separate_uv_delta_q = 1;
    }
  }

  // Select the best luma and chroma QM formulas based on encoding mode and
  // tuning
  int (*get_luma_qmlevel)(int, int, int);
  int (*get_chroma_qmlevel)(int, int, int);

  if (is_allintra) {
    if (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2) {
      if (tuning == AOM_TUNE_SSIMULACRA2) {
        // Use luma QM formula specifically tailored for tune SSIMULACRA2
        get_luma_qmlevel = aom_get_qmlevel_luma_ssimulacra2;
      } else {
        get_luma_qmlevel = aom_get_qmlevel_allintra;
      }

      if (cm->seq_params->subsampling_x == 0 &&
          cm->seq_params->subsampling_y == 0) {
        // 4:4:4 subsampling mode has 4x the number of chroma coefficients
        // compared to 4:2:0 (2x on each dimension). This means the encoder
        // should use lower chroma QM levels that more closely match the scaling
        // of an equivalent 4:2:0 chroma QM.
        get_chroma_qmlevel = aom_get_qmlevel_444_chroma;
      } else {
        // For all other chroma subsampling modes, use the all intra QM formula
        get_chroma_qmlevel = aom_get_qmlevel_allintra;
      }
    } else {
      get_luma_qmlevel = aom_get_qmlevel_allintra;
      get_chroma_qmlevel = aom_get_qmlevel_allintra;
    }
  } else {
    get_luma_qmlevel = aom_get_qmlevel;
    get_chroma_qmlevel = aom_get_qmlevel;
  }

  quant_params->qmatrix_level_y =
      get_luma_qmlevel(quant_params->base_qindex, min_qmlevel, max_qmlevel);
  quant_params->qmatrix_level_u =
      get_chroma_qmlevel(quant_params->base_qindex + quant_params->u_ac_delta_q,
                         min_qmlevel, max_qmlevel);

  if (cm->seq_params->separate_uv_delta_q) {
    quant_params->qmatrix_level_v = get_chroma_qmlevel(
        quant_params->base_qindex + quant_params->v_ac_delta_q, min_qmlevel,
        max_qmlevel);
  } else {
    quant_params->qmatrix_level_v = quant_params->qmatrix_level_u;
  }
}